

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O1

int run_test_fs_poll(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  char *in_RCX;
  void *__s1;
  undefined8 unaff_RBX;
  int iVar3;
  uv_fs_poll_t *puVar4;
  char *path;
  undefined8 in_R9;
  undefined8 uStack_4e0;
  char acStack_4d8 [1024];
  code *pcStack_d8;
  undefined1 auStack_c8 [160];
  undefined8 uStack_28;
  
  loop = (uv_loop_t *)uv_default_loop();
  remove("testfile");
  iVar3 = 0x2f6d00;
  puVar4 = (uv_fs_poll_t *)loop;
  iVar1 = uv_timer_init();
  if (iVar1 == 0) {
    iVar3 = 0x2f6d98;
    puVar4 = (uv_fs_poll_t *)loop;
    iVar1 = uv_fs_poll_init();
    if (iVar1 != 0) goto LAB_0015a905;
    puVar4 = &poll_handle;
    iVar3 = 0x15a928;
    in_RCX = (char *)0x64;
    iVar1 = uv_fs_poll_start(&poll_handle,poll_cb,"testfile");
    if (iVar1 != 0) goto LAB_0015a90a;
    iVar3 = 0;
    puVar4 = (uv_fs_poll_t *)loop;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0015a90f;
    if (poll_cb_called != 5) goto LAB_0015a914;
    if (timer_cb_called != 2) goto LAB_0015a919;
    if (close_cb_called != 1) goto LAB_0015a91e;
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar3 = 0;
    uv_run(unaff_RBX);
    puVar4 = (uv_fs_poll_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_poll_cold_1();
LAB_0015a905:
    run_test_fs_poll_cold_2();
LAB_0015a90a:
    run_test_fs_poll_cold_3();
LAB_0015a90f:
    run_test_fs_poll_cold_4();
LAB_0015a914:
    run_test_fs_poll_cold_5();
LAB_0015a919:
    run_test_fs_poll_cold_6();
LAB_0015a91e:
    run_test_fs_poll_cold_7();
  }
  run_test_fs_poll_cold_8();
  pcStack_d8 = (code *)0x15a951;
  uStack_28 = unaff_RBX;
  memset(auStack_c8,0,0xa0);
  if (puVar4 == &poll_handle) {
    pcStack_d8 = (code *)0x15a96d;
    iVar1 = uv_is_active(&poll_handle);
    if (iVar1 != 1) goto LAB_0015ab82;
    if (__s1 == (void *)0x0) goto LAB_0015ab87;
    if (in_RCX == (char *)0x0) goto LAB_0015ab8c;
    iVar1 = poll_cb_called + 1;
    switch(poll_cb_called) {
    case 0:
      poll_cb_called = iVar1;
      if (iVar3 != -2) goto LAB_0015aba0;
      pcStack_d8 = (code *)0x15a9cc;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 != 0) goto LAB_0015abb9;
      pcStack_d8 = (code *)0x15a9e6;
      path = in_RCX;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) {
        touch_file(path);
        return extraout_EAX;
      }
      goto LAB_0015abd2;
    case 1:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_0015aba5;
      pcStack_d8 = (code *)0x15ab2f;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 != 0) goto LAB_0015abbe;
      pcStack_d8 = (code *)0x15ab49;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_0015abd7;
      pcStack_d8 = (code *)0x15ab6b;
      iVar1 = uv_timer_start(&timer_handle,timer_cb,0x14,0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015abdc;
    case 2:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_0015ab96;
      pcStack_d8 = (code *)0x15aa77;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_0015abaf;
      pcStack_d8 = (code *)0x15aa91;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 != 0) {
        pcStack_d8 = (code *)0x15aab3;
        iVar1 = uv_timer_start(&timer_handle,timer_cb,200,0);
        if (iVar1 == 0) {
          return 0;
        }
        pcStack_d8 = (code *)0x15aac0;
        poll_cb_cold_10();
        iVar1 = poll_cb_called;
        goto switchD_0015a9af_caseD_3;
      }
      goto LAB_0015abc8;
    case 3:
switchD_0015a9af_caseD_3:
      poll_cb_called = iVar1;
      if (iVar3 != 0) goto LAB_0015ab9b;
      pcStack_d8 = (code *)0x15aada;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_0015abb4;
      pcStack_d8 = (code *)0x15aaf4;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 != 0) {
        iVar1 = remove("testfile");
        return iVar1;
      }
      goto LAB_0015abcd;
    case 4:
      poll_cb_called = iVar1;
      if (iVar3 != -2) goto LAB_0015ab91;
      pcStack_d8 = (code *)0x15aa1b;
      iVar1 = bcmp(__s1,auStack_c8,0xa0);
      if (iVar1 == 0) goto LAB_0015abaa;
      pcStack_d8 = (code *)0x15aa35;
      iVar1 = bcmp(in_RCX,auStack_c8,0xa0);
      if (iVar1 == 0) {
        iVar1 = uv_close(&poll_handle,close_cb);
        return iVar1;
      }
      goto LAB_0015abc3;
    }
  }
  else {
    pcStack_d8 = (code *)0x15ab82;
    poll_cb_cold_1();
LAB_0015ab82:
    pcStack_d8 = (code *)0x15ab87;
    poll_cb_cold_2();
LAB_0015ab87:
    pcStack_d8 = (code *)0x15ab8c;
    poll_cb_cold_22();
LAB_0015ab8c:
    pcStack_d8 = (code *)0x15ab91;
    poll_cb_cold_21();
LAB_0015ab91:
    pcStack_d8 = (code *)0x15ab96;
    poll_cb_cold_3();
LAB_0015ab96:
    pcStack_d8 = (code *)0x15ab9b;
    poll_cb_cold_9();
LAB_0015ab9b:
    pcStack_d8 = (code *)0x15aba0;
    poll_cb_cold_6();
LAB_0015aba0:
    pcStack_d8 = (code *)0x15aba5;
    poll_cb_cold_17();
LAB_0015aba5:
    pcStack_d8 = (code *)0x15abaa;
    poll_cb_cold_13();
LAB_0015abaa:
    pcStack_d8 = (code *)0x15abaf;
    poll_cb_cold_5();
LAB_0015abaf:
    pcStack_d8 = (code *)0x15abb4;
    poll_cb_cold_12();
LAB_0015abb4:
    pcStack_d8 = (code *)0x15abb9;
    poll_cb_cold_8();
LAB_0015abb9:
    pcStack_d8 = (code *)0x15abbe;
    poll_cb_cold_18();
LAB_0015abbe:
    pcStack_d8 = (code *)0x15abc3;
    poll_cb_cold_14();
LAB_0015abc3:
    pcStack_d8 = (code *)0x15abc8;
    poll_cb_cold_4();
LAB_0015abc8:
    pcStack_d8 = (code *)0x15abcd;
    poll_cb_cold_11();
LAB_0015abcd:
    pcStack_d8 = (code *)0x15abd2;
    poll_cb_cold_7();
LAB_0015abd2:
    pcStack_d8 = (code *)0x15abd7;
    poll_cb_cold_19();
LAB_0015abd7:
    pcStack_d8 = (code *)0x15abdc;
    poll_cb_cold_16();
LAB_0015abdc:
    pcStack_d8 = (code *)0x15abe1;
    poll_cb_cold_15();
    iVar1 = poll_cb_called;
  }
  poll_cb_called = iVar1;
  pcStack_d8 = run_test_fs_poll_getpath;
  poll_cb_cold_20();
  pcStack_d8 = (code *)in_RCX;
  loop = (uv_loop_t *)uv_default_loop();
  remove("testfile");
  iVar1 = uv_fs_poll_init(loop,&poll_handle);
  if (iVar1 == 0) {
    uStack_4e0 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,acStack_4d8);
    if (iVar1 != -0x16) goto LAB_0015ad41;
    iVar1 = uv_fs_poll_start(&poll_handle,poll_cb_fail,"testfile",100);
    if (iVar1 != 0) goto LAB_0015ad46;
    uStack_4e0 = 0x400;
    iVar1 = uv_fs_poll_getpath(&poll_handle,acStack_4d8);
    if (iVar1 != 0) goto LAB_0015ad4b;
    if (acStack_4d8[uStack_4e0 - 1] == '\0') goto LAB_0015ad50;
    if (acStack_4d8[uStack_4e0] != '\0') goto LAB_0015ad55;
    iVar1 = bcmp(acStack_4d8,"testfile",uStack_4e0);
    if (iVar1 != 0) goto LAB_0015ad5a;
    uv_close(&poll_handle,close_cb);
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_0015ad5f;
    if (close_cb_called == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0015ad69;
    }
  }
  else {
    run_test_fs_poll_getpath_cold_1();
LAB_0015ad41:
    run_test_fs_poll_getpath_cold_2();
LAB_0015ad46:
    run_test_fs_poll_getpath_cold_3();
LAB_0015ad4b:
    run_test_fs_poll_getpath_cold_4();
LAB_0015ad50:
    run_test_fs_poll_getpath_cold_10();
LAB_0015ad55:
    run_test_fs_poll_getpath_cold_5();
LAB_0015ad5a:
    run_test_fs_poll_getpath_cold_6();
LAB_0015ad5f:
    run_test_fs_poll_getpath_cold_7();
  }
  run_test_fs_poll_getpath_cold_8();
LAB_0015ad69:
  run_test_fs_poll_getpath_cold_9();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-poll.c"
          ,0x58,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_poll) {
  loop = uv_default_loop();

  remove(FIXTURE);

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_fs_poll_init(loop, &poll_handle));
  ASSERT(0 == uv_fs_poll_start(&poll_handle, poll_cb, FIXTURE, 100));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(poll_cb_called == 5);
  ASSERT(timer_cb_called == 2);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}